

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONScanner.cpp
# Opt level: O2

void __thiscall
JSON::JSONScanner::Init
          (JSONScanner *this,char16 *input,uint len,Token *pOutToken,ScriptContext *sc,
          char16 *current,ArenaAllocator *allocator)

{
  ArenaAllocator *in_stack_00000008;
  
  this->inputText = input;
  this->currentChar = current;
  this->inputLen = len;
  this->pToken = pOutToken;
  this->scriptContext = sc;
  this->allocator = in_stack_00000008;
  return;
}

Assistant:

void JSONScanner::Init(const char16* input, uint len, Token* pOutToken, Js::ScriptContext* sc, const char16* current, ArenaAllocator* allocator)
    {
        // Note that allocator could be nullptr from JSONParser, if we could not reuse an allocator, keep our own
        inputText = input;
        currentChar = current;
        inputLen = len;
        pToken = pOutToken;
        scriptContext = sc;
        this->allocator = allocator;
    }